

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O3

TypeAndOffset * __thiscall
soul::SubElementPath::getElement
          (TypeAndOffset *__return_storage_ptr__,SubElementPath *this,Type *parentType)

{
  Category CVar1;
  size_t sVar2;
  bool bVar3;
  PrimitiveType PVar4;
  BoundedIntSize BVar5;
  bool bVar6;
  Structure *oldObject;
  uint64_t uVar7;
  Structure *pSVar8;
  int line;
  unsigned_long *puVar9;
  unsigned_long *puVar10;
  long lVar11;
  ulong uVar12;
  char *local_50;
  Type local_48;
  
  CVar1 = parentType->arrayElementCategory;
  bVar6 = parentType->isRef;
  bVar3 = parentType->isConstant;
  PVar4.type = (parentType->primitiveType).type;
  (__return_storage_ptr__->type).category = parentType->category;
  (__return_storage_ptr__->type).arrayElementCategory = CVar1;
  (__return_storage_ptr__->type).isRef = bVar6;
  (__return_storage_ptr__->type).isConstant = bVar3;
  (__return_storage_ptr__->type).primitiveType = (PrimitiveType)PVar4.type;
  BVar5 = parentType->arrayElementBoundingSize;
  (__return_storage_ptr__->type).boundingSize = parentType->boundingSize;
  (__return_storage_ptr__->type).arrayElementBoundingSize = BVar5;
  pSVar8 = (parentType->structure).object;
  (__return_storage_ptr__->type).structure.object = pSVar8;
  if (pSVar8 != (Structure *)0x0) {
    (pSVar8->super_RefCountedObject).refCount = (pSVar8->super_RefCountedObject).refCount + 1;
  }
  __return_storage_ptr__->offset = 0;
  sVar2 = (this->indexes).numActive;
  if (sVar2 != 0) {
    puVar10 = (this->indexes).items;
    puVar9 = puVar10 + sVar2;
    local_50 = "! e.type.isUnsizedArray()";
    do {
      CVar1 = (__return_storage_ptr__->type).category;
      if ((CVar1 & ~primitive) == vector) {
        if ((CVar1 == array) && ((__return_storage_ptr__->type).boundingSize == 0)) {
          line = 0x22e;
LAB_001bc10c:
          throwInternalCompilerError(local_50,"getElement",line);
        }
        bVar6 = Type::isValidArrayOrVectorIndex<unsigned_long>
                          (&__return_storage_ptr__->type,*puVar10);
        if (!bVar6) {
          line = 0x22f;
          local_50 = "e.type.isValidArrayOrVectorIndex (index)";
          goto LAB_001bc10c;
        }
        Type::getElementType(&local_48,&__return_storage_ptr__->type);
        (__return_storage_ptr__->type).category = local_48.category;
        (__return_storage_ptr__->type).arrayElementCategory = local_48.arrayElementCategory;
        (__return_storage_ptr__->type).isRef = local_48.isRef;
        (__return_storage_ptr__->type).isConstant = local_48.isConstant;
        (__return_storage_ptr__->type).primitiveType = (PrimitiveType)local_48.primitiveType.type;
        (__return_storage_ptr__->type).boundingSize = local_48.boundingSize;
        (__return_storage_ptr__->type).arrayElementBoundingSize = local_48.arrayElementBoundingSize;
        pSVar8 = (__return_storage_ptr__->type).structure.object;
        if (local_48.structure.object != pSVar8) {
          (__return_storage_ptr__->type).structure.object = local_48.structure.object;
          local_48.structure.object = (Structure *)0x0;
          RefCountedPtr<soul::Structure>::decIfNotNull(pSVar8);
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
        uVar7 = Type::getPackedSizeInBytes(&__return_storage_ptr__->type);
        __return_storage_ptr__->offset = __return_storage_ptr__->offset + uVar7 * *puVar10;
      }
      else {
        if (CVar1 != structure) {
          throwInternalCompilerError("getElement",0x242);
        }
        pSVar8 = Type::getStructRef(&__return_storage_ptr__->type);
        if ((pSVar8->members).numActive <= *puVar10) {
          throwInternalCompilerError("index < members.size()","getElement",0x239);
        }
        Type::operator=(&__return_storage_ptr__->type,&(pSVar8->members).items[*puVar10].type);
        if (*puVar10 != 0) {
          lVar11 = 0;
          uVar12 = 0;
          do {
            if ((pSVar8->members).numActive <= uVar12) {
              throwInternalCompilerError("index < numActive","operator[]",0x9e);
            }
            uVar7 = Type::getPackedSizeInBytes
                              ((Type *)(&(((pSVar8->members).items)->type).category + lVar11));
            __return_storage_ptr__->offset = __return_storage_ptr__->offset + uVar7;
            uVar12 = uVar12 + 1;
            lVar11 = lVar11 + 0x40;
          } while (uVar12 < *puVar10);
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

SubElementPath::TypeAndOffset SubElementPath::getElement (const Type& parentType) const
{
    TypeAndOffset e { parentType, 0 };

    for (auto& index : indexes)
    {
        if (e.type.isArrayOrVector())
        {
            SOUL_ASSERT (! e.type.isUnsizedArray());
            SOUL_ASSERT (e.type.isValidArrayOrVectorIndex (index));

            e.type = e.type.getElementType();
            e.offset += ((size_t) e.type.getPackedSizeInBytes()) * index;
            continue;
        }

        if (e.type.isStruct())
        {
            auto& members = e.type.getStructRef().getMembers();
            SOUL_ASSERT (index < members.size());
            e.type = members[index].type;

            for (size_t i = 0; i < index; ++i)
                e.offset += (size_t) members[i].type.getPackedSizeInBytes();

            continue;
        }

        SOUL_ASSERT_FALSE;
    }

    return e;
}